

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * QString::fromLatin1(QByteArrayView ba)

{
  const_pointer pvVar1;
  qsizetype qVar2;
  char16_t *pcVar3;
  char *in_RDX;
  size_t in_RSI;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  char16_t *dst;
  DataPointer d;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffff60;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffff68;
  qsizetype in_stack_ffffffffffffff70;
  qsizetype in_stack_ffffffffffffff78;
  QArrayDataPointer<char16_t> *this;
  QArrayDataPointer<char16_t> local_30;
  char16_t *dst_00;
  
  dst_00 = *(char16_t **)(in_FS_OFFSET + 0x28);
  local_30.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_30.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_30.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_30);
  pvVar1 = QByteArrayView::data((QByteArrayView *)&stack0xffffffffffffffe8);
  if (pvVar1 != (const_pointer)0x0) {
    qVar2 = QByteArrayView::size((QByteArrayView *)&stack0xffffffffffffffe8);
    if (qVar2 == 0) {
      QArrayDataPointer<char16_t>::fromRawData
                ((char16_t *)in_stack_ffffffffffffff68,(qsizetype)in_stack_ffffffffffffff60);
      QArrayDataPointer<char16_t>::operator=(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_ffffffffffffff60);
    }
    else {
      in_stack_ffffffffffffff60 =
           (QArrayDataPointer<char16_t> *)
           QByteArrayView::size((QByteArrayView *)&stack0xffffffffffffffe8);
      QByteArrayView::size((QByteArrayView *)&stack0xffffffffffffffe8);
      QArrayDataPointer<char16_t>::QArrayDataPointer
                (this,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                 (AllocationOption)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      QArrayDataPointer<char16_t>::operator=(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_ffffffffffffff60);
      qt_noop();
      pcVar3 = QArrayDataPointer<char16_t>::data(&local_30);
      qVar2 = QByteArrayView::size((QByteArrayView *)&stack0xffffffffffffffe8);
      pcVar3[qVar2] = L'\0';
      QArrayDataPointer<char16_t>::data(&local_30);
      QByteArrayView::data((QByteArrayView *)&stack0xffffffffffffffe8);
      QByteArrayView::size((QByteArrayView *)&stack0xffffffffffffffe8);
      qt_from_latin1(dst_00,in_RDX,in_RSI);
    }
  }
  QString((QString *)in_stack_ffffffffffffff60,&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_ffffffffffffff60);
  if (*(char16_t **)(in_FS_OFFSET + 0x28) != dst_00) {
    __stack_chk_fail();
  }
  return (QString *)in_RDI;
}

Assistant:

QString QString::fromLatin1(QByteArrayView ba)
{
    DataPointer d;
    if (!ba.data()) {
        // nothing to do
    } else if (ba.size() == 0) {
        d = DataPointer::fromRawData(&_empty, 0);
    } else {
        d = DataPointer(ba.size(), ba.size());
        Q_CHECK_PTR(d.data());
        d.data()[ba.size()] = '\0';
        char16_t *dst = d.data();

        qt_from_latin1(dst, ba.data(), size_t(ba.size()));
    }
    return QString(std::move(d));
}